

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::write_metadep_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  size_t buflen;
  tc_meta_entry *ptVar1;
  
  CVmFile::write_uint2(fp,this->meta_cnt_);
  ptVar1 = (tc_meta_entry *)&this->meta_head_;
  while (ptVar1 = ptVar1->nxt, ptVar1 != (tc_meta_entry *)0x0) {
    buflen = strlen(ptVar1->nm);
    CVmFile::write_uint2(fp,(uint)buflen);
    CVmFile::write_bytes(fp,ptVar1->nm,buflen);
  }
  return;
}

Assistant:

void CTcGenTarg::write_metadep_to_object_file(CVmFile *fp)
{
    tc_meta_entry *cur;

    /* write the count */
    fp->write_uint2(meta_cnt_);

    /* write the entries */
    for (cur = meta_head_ ; cur != 0 ; cur = cur->nxt)
    {
        size_t len;

        len = strlen(cur->nm);
        fp->write_uint2(len);
        fp->write_bytes(cur->nm, len);
    }
}